

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManSetFlowRefs(Gia_Man_t *p,Vec_Int_t *vRefs)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_44;
  int Id;
  int i;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVStack_18;
  int fDiscount;
  Vec_Int_t *vRefs_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = 1;
  pVStack_18 = vRefs;
  vRefs_local = (Vec_Int_t *)p;
  iVar2 = Gia_ManObjNum(p);
  Vec_IntFill(vRefs,iVar2,0);
  local_44 = 0;
  while( true ) {
    bVar5 = false;
    if (local_44 < *(int *)&vRefs_local[1].pArray) {
      pCtrl = Gia_ManObj((Gia_Man_t *)vRefs_local,local_44);
      bVar5 = pCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(pCtrl);
    if (iVar2 != 0) {
      pGVar4 = Gia_ObjFanin0(pCtrl);
      iVar2 = Gia_ObjIsAnd(pGVar4);
      pVVar1 = pVStack_18;
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFaninId0(pCtrl,local_44);
        Vec_IntAddToEntry(pVVar1,iVar2,1);
      }
      pGVar4 = Gia_ObjFanin1(pCtrl);
      iVar2 = Gia_ObjIsAnd(pGVar4);
      pVVar1 = pVStack_18;
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFaninId1(pCtrl,local_44);
        Vec_IntAddToEntry(pVVar1,iVar2,1);
      }
      if (vRefs_local[2].pArray == (int *)0x0) {
        if ((pObj._4_4_ != 0) && (iVar2 = Gia_ObjIsMuxType(pCtrl), iVar2 != 0)) {
          pGVar4 = Gia_ObjRecognizeMux(pCtrl,(Gia_Obj_t **)&Id,&pData1);
          pData0 = Gia_Regular(pGVar4);
          pData1 = Gia_Regular(pData1);
          _Id = Gia_Regular(_Id);
          iVar2 = Gia_ObjIsAnd(pData0);
          pVVar1 = pVStack_18;
          if (iVar2 != 0) {
            iVar2 = Gia_ObjId((Gia_Man_t *)vRefs_local,pData0);
            Vec_IntAddToEntry(pVVar1,iVar2,-1);
          }
          if ((pData1 == _Id) && (iVar2 = Gia_ObjIsAnd(pData1), pVVar1 = pVStack_18, iVar2 != 0)) {
            iVar2 = Gia_ObjId((Gia_Man_t *)vRefs_local,pData1);
            Vec_IntAddToEntry(pVVar1,iVar2,-1);
          }
        }
      }
      else {
        iVar2 = Gia_ObjIsMuxId((Gia_Man_t *)vRefs_local,local_44);
        if (iVar2 != 0) {
          pGVar4 = Gia_ObjFanin2((Gia_Man_t *)vRefs_local,pCtrl);
          iVar2 = Gia_ObjIsAnd(pGVar4);
          pVVar1 = pVStack_18;
          if (iVar2 != 0) {
            iVar2 = Gia_ObjFaninId2((Gia_Man_t *)vRefs_local,local_44);
            Vec_IntAddToEntry(pVVar1,iVar2,1);
          }
        }
      }
    }
    local_44 = local_44 + 1;
  }
  for (local_44 = 0; iVar2 = Vec_IntSize((Vec_Int_t *)vRefs_local[4].pArray), pVVar1 = vRefs_local,
      local_44 < iVar2; local_44 = local_44 + 1) {
    pGVar4 = Gia_ManCo((Gia_Man_t *)vRefs_local,local_44);
    iVar2 = Gia_ObjFaninId0p((Gia_Man_t *)pVVar1,pGVar4);
    pGVar4 = Gia_ManObj((Gia_Man_t *)vRefs_local,iVar2);
    iVar3 = Gia_ObjIsAnd(pGVar4);
    if (iVar3 != 0) {
      Vec_IntAddToEntry(pVStack_18,iVar2,1);
    }
  }
  for (local_44 = 0; iVar2 = Vec_IntSize(pVStack_18), local_44 < iVar2; local_44 = local_44 + 1) {
    Vec_IntUpdateEntry(pVStack_18,local_44,1);
  }
  return;
}

Assistant:

void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_IntFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAnd(Gia_ObjFanin2(p, pObj)) )
                Vec_IntAddToEntry( vRefs, Gia_ObjFaninId2(p, i), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAnd(pCtrl) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pCtrl), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAnd(pData0) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pData0), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Id)) )
            Vec_IntAddToEntry( vRefs, Id, 1 );
    for ( i = 0; i < Vec_IntSize(vRefs); i++ )
        Vec_IntUpdateEntry( vRefs, i, 1 );
}